

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O3

bool __thiscall smf::MidiFile::writeBinascWithComments(MidiFile *this,ostream *output)

{
  size_t in_RCX;
  void *__buf;
  Binasc binasc;
  stringstream binarydata;
  Binasc local_1ac;
  stringstream local_198 [16];
  undefined1 local_188 [112];
  ios_base local_118 [264];
  
  std::__cxx11::stringstream::stringstream(local_198);
  write(this,(int)local_188,__buf,in_RCX);
  this->m_rwstatus = true;
  Binasc::Binasc(&local_1ac);
  Binasc::setMidiOn(&local_1ac);
  Binasc::setCommentsOn(&local_1ac);
  std::istream::seekg((long)local_198,_S_beg);
  Binasc::readFromBinary(&local_1ac,output,(istream *)local_198);
  Binasc::~Binasc(&local_1ac);
  std::__cxx11::stringstream::~stringstream(local_198);
  std::ios_base::~ios_base(local_118);
  return true;
}

Assistant:

bool MidiFile::writeBinascWithComments(std::ostream& output) {
	std::stringstream binarydata;
	m_rwstatus = write(binarydata);
	if (m_rwstatus == false) {
		return false;
	}

	Binasc binasc;
	binasc.setMidiOn();
	binasc.setCommentsOn();
	binarydata.seekg(0, std::ios_base::beg);
	binasc.readFromBinary(output, binarydata);
	return true;
}